

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::Formatter::operator()
          (Formatter *this,char *format,uint *args,uint *args_1)

{
  Printer *this_00;
  char *pcVar1;
  uint x;
  long lVar2;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_89;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  this_00 = this->printer_;
  ToString<unsigned_int,void>(&local_70,(Formatter *)(ulong)*args,(uint)args);
  ToString<unsigned_int,void>(&local_50,(Formatter *)(ulong)*args_1,x);
  __l._M_len = 2;
  __l._M_array = &local_70;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_88,__l,&local_89);
  io::Printer::FormatInternal(this_00,&local_88,&this->vars_,format);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_88);
  lVar2 = 0;
  do {
    pcVar1 = *(char **)((long)&local_50._M_dataplus._M_p + lVar2);
    if (local_50.field_2._M_local_buf + lVar2 != pcVar1) {
      operator_delete(pcVar1);
    }
    lVar2 = lVar2 + -0x20;
  } while (lVar2 != -0x40);
  return;
}

Assistant:

void operator()(const char* format, const Args&... args) const {
    printer_->FormatInternal({ToString(args)...}, vars_, format);
  }